

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yarn2.cc
# Opt level: O1

void __thiscall trng::yarn2::yarn2(yarn2 *this,unsigned_long s,parameter_type P)

{
  int iVar1;
  int iVar2;
  
  *&(this->P).a = P.a;
  (this->S).r[1] = 1;
  iVar1 = (int)((long)s % 0x7fffffff);
  iVar2 = iVar1 + 0x7fffffff;
  if (-1 < (long)s % 0x7fffffff) {
    iVar2 = iVar1;
  }
  (this->S).r[0] = iVar2;
  return;
}

Assistant:

yarn2::yarn2(unsigned long s, yarn2::parameter_type P) : P{P} { seed(s); }